

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_write_hot_dirty_pages(Pager *pPager,Page *pDirty)

{
  Page *pPVar1;
  Page *pNext;
  Page *pPStack_18;
  int rc;
  Page *pDirty_local;
  Pager *pPager_local;
  
  pNext._4_4_ = 0;
  pPStack_18 = pDirty;
  while ((pPStack_18 != (Page *)0x0 &&
         ((pPVar1 = pPStack_18->pPrevHot, (pPStack_18->flags & 8U) != 0 ||
          (pNext._4_4_ = unqliteOsWrite(pPager->pfd,pPStack_18->zData,(long)pPager->iPageSize,
                                        pPStack_18->pgno * (long)pPager->iPageSize),
          pNext._4_4_ == 0))))) {
    pPStack_18->flags = pPStack_18->flags & 0xffffff91;
    if (pPStack_18->pDirtyPrev == (Page *)0x0) {
      pPager->pDirty = pPStack_18->pDirtyNext;
    }
    else {
      pPStack_18->pDirtyPrev->pDirtyNext = pPStack_18->pDirtyNext;
    }
    if (pPStack_18->pDirtyNext == (Page *)0x0) {
      pPager->pFirstDirty = pPStack_18->pDirtyPrev;
    }
    else {
      pPStack_18->pDirtyNext->pDirtyPrev = pPStack_18->pDirtyPrev;
    }
    pager_unlink_page(pPager,pPStack_18);
    pager_release_page(pPager,pPStack_18);
    pPStack_18 = pPVar1;
  }
  return pNext._4_4_;
}

Assistant:

static int pager_write_hot_dirty_pages(Pager *pPager,Page *pDirty)
{
	int rc = UNQLITE_OK;
	Page *pNext;
	for(;;){
		if( pDirty == 0 ){
			break;
		}
		/* Point to the next page */
		pNext = pDirty->pPrevHot; /* Not a bug: Reverse link */
		if( (pDirty->flags & PAGE_DONT_WRITE) == 0 ){
			rc = unqliteOsWrite(pPager->pfd,pDirty->zData,pPager->iPageSize,pDirty->pgno * pPager->iPageSize);
			if( rc != UNQLITE_OK ){
				break;
			}
		}
		/* Remove stale flags */
		pDirty->flags &= ~(PAGE_DIRTY|PAGE_DONT_WRITE|PAGE_NEED_SYNC|PAGE_IN_JOURNAL|PAGE_HOT_DIRTY);
		/* Unlink from the list of dirty pages */
		if( pDirty->pDirtyPrev ){
			pDirty->pDirtyPrev->pDirtyNext = pDirty->pDirtyNext;
		}else{
			pPager->pDirty = pDirty->pDirtyNext;
		}
		if( pDirty->pDirtyNext ){
			pDirty->pDirtyNext->pDirtyPrev = pDirty->pDirtyPrev;
		}else{
			pPager->pFirstDirty = pDirty->pDirtyPrev;
		}
		/* Discard */
		pager_unlink_page(pPager,pDirty);
		/* Release the page */
		pager_release_page(pPager,pDirty);
		/* Next hot page */
		pDirty = pNext;
	}
	return rc;
}